

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.cpp
# Opt level: O1

void __thiscall antlr::TreeParser::reportWarning(TreeParser *this,string *s)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"warning: ",9);
  __s = (s->_M_dataplus)._M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x3156a8);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void TreeParser::reportWarning(const ANTLR_USE_NAMESPACE(std)string& s)
{
	ANTLR_USE_NAMESPACE(std)cerr << "warning: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}